

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::WebSocketImpl::abort(WebSocketImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  uchar *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  
  if ((this->queuedControlMessage).ptr.isSet == true) {
    (this->queuedControlMessage).ptr.isSet = false;
    pPVar1 = (this->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (this->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr =
           (PromiseFulfiller<void> *)0x0;
      pDVar2 = (this->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector +
                        (long)(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2]));
    }
    puVar3 = (this->queuedControlMessage).ptr.field_1.value.payload.ptr;
    if (puVar3 != (uchar *)0x0) {
      sVar4 = (this->queuedControlMessage).ptr.field_1.value.payload.size_;
      (this->queuedControlMessage).ptr.field_1.value.payload.ptr = (uchar *)0x0;
      (this->queuedControlMessage).ptr.field_1.value.payload.size_ = 0;
      pAVar5 = (this->queuedControlMessage).ptr.field_1.value.payload.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,puVar3,1,sVar4,sVar4,0);
    }
  }
  if ((this->sendingControlMessage).ptr.isSet == true) {
    (this->sendingControlMessage).ptr.isSet = false;
    node = (this->sendingControlMessage).ptr.field_1;
    if (node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
      (this->sendingControlMessage).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  this->disconnected = true;
  (*(((this->stream).ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[7])();
  (*(((this->stream).ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[6])();
  return;
}

Assistant:

void abort() override {
    queuedControlMessage = kj::none;
    sendingControlMessage = kj::none;
    disconnected = true;
    stream->abortRead();
    stream->shutdownWrite();
  }